

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<kj::Array<unsigned_char>_>::~ExceptionOr
          (ExceptionOr<kj::Array<unsigned_char>_> *this)

{
  ExceptionOr<kj::Array<unsigned_char>_> *this_local;
  
  Maybe<kj::Array<unsigned_char>_>::~Maybe(&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}